

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

tab_str_t *
str_add(tab_str_t *__return_storage_ptr__,c2m_ctx_t c2m_ctx,char *s,size_t len,size_t key,
       size_t flags,int key_p)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  tab_str_t el_00;
  tab_str_t el_01;
  tab_str_t el_02;
  int iVar4;
  char *__dest;
  tab_str_t *res;
  tab_str_t str;
  tab_str_t el;
  tab_str_t local_98;
  tab_str_t local_78;
  char *local_50;
  size_t sStack_48;
  undefined8 uStack_40;
  size_t sStack_38;
  
  res = &local_98;
  el_00.str.len = len;
  el_00.str.s = s;
  el_00.key = uStack_40;
  el_00.flags = sStack_38;
  local_50 = s;
  sStack_48 = len;
  iVar4 = HTAB_tab_str_t_do(c2m_ctx->str_tab,el_00,HTAB_FIND,res);
  if (iVar4 == 0) {
    __dest = (char *)reg_malloc(c2m_ctx,len);
    memcpy(__dest,s,len);
    el_01.str.len = len;
    el_01.str.s = __dest;
    el_01.key = key;
    el_01.flags = flags;
    local_98.str.s = __dest;
    local_98.str.len = len;
    local_98.key = key;
    local_98.flags = flags;
    HTAB_tab_str_t_do(c2m_ctx->str_tab,el_01,HTAB_INSERT,&local_78);
    if (key_p != 0) {
      el_02.str.len = local_98.str.len;
      el_02.str.s = local_98.str.s;
      el_02.key = local_98.key;
      el_02.flags = local_98.flags;
      HTAB_tab_str_t_do(c2m_ctx->str_key_tab,el_02,HTAB_INSERT,&local_78);
    }
  }
  else {
    res = &local_78;
    local_78.str.s = local_98.str.s;
    local_78.str.len = local_98.str.len;
    local_78.key = local_98.key;
    local_78.flags = local_98.flags;
  }
  sVar1 = (res->str).len;
  sVar2 = res->key;
  sVar3 = res->flags;
  (__return_storage_ptr__->str).s = (res->str).s;
  (__return_storage_ptr__->str).len = sVar1;
  __return_storage_ptr__->key = sVar2;
  __return_storage_ptr__->flags = sVar3;
  return __return_storage_ptr__;
}

Assistant:

static tab_str_t str_add (c2m_ctx_t c2m_ctx, const char *s, size_t len, size_t key, size_t flags,
                          int key_p) {
  char *heap_s;
  tab_str_t el, str;

  if (str_exists_p (c2m_ctx, s, len, &el)) return el;
  heap_s = reg_malloc (c2m_ctx, len);
  memcpy (heap_s, s, len);
  str.str.s = heap_s;
  str.str.len = len;
  str.key = key;
  str.flags = flags;
  HTAB_DO (tab_str_t, str_tab, str, HTAB_INSERT, el);
  if (key_p) HTAB_DO (tab_str_t, str_key_tab, str, HTAB_INSERT, el);
  return str;
}